

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O2

bool __thiscall Plane::intersect(Plane *this,Ray *r,double *t)

{
  double dVar1;
  double dVar2;
  
  PlaneTestCount = PlaneTestCount + 1;
  dVar1 = operator&(&this->normal,&r->dir);
  if (0.01 <= ABS(dVar1)) {
    dVar2 = operator&(&this->normal,&r->org);
    dVar1 = -(dVar2 + this->dist) / dVar1;
    *t = dVar1;
    if (geom_threshold < dVar1) {
      return true;
    }
  }
  PlaneTestMisses = PlaneTestMisses + 1;
  return false;
}

Assistant:

bool Plane::intersect(Ray& r, double& t)
{
   STAT( PlaneTestCount++  );

   double vd = normal & r.dir;

   if(   vd > -EPS && vd   < EPS )
   {
      STAT( PlaneTestMisses++ );
      return false;
   }

   t =   -((normal & r.org) + dist) / vd;

   if(   t >   geom_threshold )
      return true;
   else
   {
      STAT(PlaneTestMisses++);
      return false;
   }
}